

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall
CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::CLParam
          (CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,string *param_name,string *info,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_val)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  undefined1 *puVar4;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_name_split;
  char *in_stack_ffffffffffffff40;
  string *this_00;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff88;
  string local_70 [32];
  string local_50 [56];
  string *local_18;
  
  *in_RDI = &PTR__CLParam_0013ebe0;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(undefined1 *)(in_RDI + 5) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 6),local_18);
  this_01 = (string *)(in_RDI + 10);
  std::__cxx11::string::string(this_01,in_RCX);
  this_00 = (string *)(in_RDI + 0xe);
  std::__cxx11::string::string(this_00,in_RCX);
  *(undefined1 *)(in_RDI + 0x12) = 0;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::operator+((char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   in_stack_ffffffffffffff40);
    std::__cxx11::string::operator=((string *)(in_RDI + 6),local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
  }
  CLOptionsHelper::split((string *)in_RCX,(char)((ulong)this_01 >> 0x38));
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffff78);
  if (sVar2 == 2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&stack0xffffffffffffff78,0);
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)pvVar3);
    *(undefined1 *)(in_RDI + 5) = *puVar4;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&stack0xffffffffffffff78,1);
    std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)pvVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  return;
}

Assistant:

CLParam<T>(const std::string& param_name,
               const std::string& info,
               T default_val) :
        parameter_name(param_name), description(info),
        value(default_val), default_value(default_val),
        is_set(false)
    {
        if (description.empty()) description="No description for " + parameter_name + ". I guess you're on your own.";
        std::vector<std::string> param_name_split = CLOptionsHelper::split(param_name, ',') ;
        if (param_name_split.size() == 2) {
            parameter_name_short = param_name_split[0][0] ;
            parameter_name = param_name_split[1] ;
        }
    }